

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ActiveAttributesCase::test(ActiveAttributesCase *this)

{
  TestContext *pTVar1;
  GLint GVar2;
  ApiCase *pAVar3;
  GLuint GVar4;
  GLuint shader;
  GLuint program;
  deBool dVar5;
  CallLogWrapper *this_00;
  allocator<char> local_9e5;
  GLint written;
  GLuint local_9e0;
  GLint size;
  ApiCase *local_9d8;
  GLuint local_9cc;
  GLuint local_9c8;
  GLenum type;
  CallLogWrapper *local_9c0;
  GLint written_1;
  GLint local_9b0 [94];
  char buffer [2048];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,GVar4,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar4);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,GVar4);
  local_9c8 = shader;
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,program,0x8b89,2);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"longInputAttributeName",(allocator<char> *)&written_1);
  local_9d8 = &this->super_ApiCase;
  local_9cc = GVar4;
  verifyProgramParam(pTVar1,this_00,program,0x8b8a,buffer._8_4_ + 1);
  std::__cxx11::string::~string((string *)buffer);
  GVar4 = 0;
  local_9e0 = program;
  local_9c0 = this_00;
  do {
    if (GVar4 == 2) {
      memset((string *)buffer,0,0x800);
      _written_1 = (TestLog *)((ulong)_written_1 & 0xffffffff00000000);
      written = 0;
      buffer[0] = 'x';
      size = 0;
      glu::CallLogWrapper::glGetActiveAttrib
                (this_00,program,0,1,&written_1,&written,(GLenum *)&size,(GLchar *)buffer);
      pAVar3 = local_9d8;
      ApiCase::expectError(local_9d8,0);
      checkIntEquals((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,written_1,0);
      glu::CallLogWrapper::glDeleteShader(this_00,local_9cc);
      glu::CallLogWrapper::glDeleteShader(this_00,local_9c8);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      ApiCase::expectError(pAVar3,0);
      return;
    }
    memset((string *)buffer,0,0x800);
    written = 0;
    size = 0;
    buffer[0] = 'x';
    type = 0;
    glu::CallLogWrapper::glGetActiveAttrib
              (this_00,program,GVar4,0x800,&written,&size,&type,(GLchar *)buffer);
    pAVar3 = local_9d8;
    ApiCase::expectError(local_9d8,0);
    dVar5 = deStringBeginsWith(buffer,"longInputAttributeName");
    GVar2 = written;
    if (dVar5 == 0) {
      dVar5 = deStringBeginsWith(buffer,"shortName");
      pAVar3 = local_9d8;
      GVar2 = written;
      if (dVar5 != 0) {
        pTVar1 = (((ApiCase *)&local_9d8->super_TestCase)->super_TestCase).super_TestCase.
                 super_TestNode.m_testCtx;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&written_1,"shortName",&local_9e5);
        checkIntEquals(pTVar1,GVar2,local_9b0[0]);
        goto LAB_010db091;
      }
      _written_1 = ((((ApiCase *)&local_9d8->super_TestCase)->super_TestCase).super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b0);
      std::operator<<((ostream *)local_9b0,"// ERROR: Got unexpected attribute name.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&written_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b0);
      program = local_9e0;
      pTVar1 = (((ApiCase *)&pAVar3->super_TestCase)->super_TestCase).super_TestCase.super_TestNode.
               m_testCtx;
      if (pTVar1->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,"got unexpected name");
      }
    }
    else {
      pTVar1 = (pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&written_1,"longInputAttributeName",&local_9e5);
      checkIntEquals(pTVar1,GVar2,local_9b0[0]);
LAB_010db091:
      std::__cxx11::string::~string((string *)&written_1);
      this_00 = local_9c0;
      program = local_9e0;
    }
    GVar4 = GVar4 + 1;
  } while( true );
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"in highp vec2 longInputAttributeName;\n"
			"in highp vec2 shortName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = longInputAttributeName.yxxy + shortName.xyxy;\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_ATTRIBUTES, 2);
		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_ATTRIBUTE_MAX_LENGTH, (GLint)std::string("longInputAttributeName").length() + 1); // does include null-terminator

		// check names
		for (int attributeNdx = 0; attributeNdx < 2; ++attributeNdx)
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			GLint size = 0;
			GLenum type = 0;
			glGetActiveAttrib(program, attributeNdx, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);
			expectError(GL_NO_ERROR);

			if (deStringBeginsWith(buffer, "longInputAttributeName"))
			{
				checkIntEquals(m_testCtx, written, (GLint)std::string("longInputAttributeName").length()); // does NOT include null-terminator
			}
			else if (deStringBeginsWith(buffer, "shortName"))
			{
				checkIntEquals(m_testCtx, written, (GLint)std::string("shortName").length()); // does NOT include null-terminator
			}
			else
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Got unexpected attribute name." << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected name");
			}
		}

		// and with too short buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			GLint size = 0;
			GLenum type = 0;

			glGetActiveAttrib(program, 0, 1, &written, &size, &type, buffer);
			expectError(GL_NO_ERROR);
			checkIntEquals(m_testCtx, written, 0);
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}